

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void clunk::InitRookMoves(int from)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint local_40;
  int end;
  int dir;
  int i;
  int shift;
  uint64_t mvs;
  int DIRECTION [4];
  int from_local;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x21b,"void clunk::InitRookMoves(const int)");
  }
  DIRECTION[0] = 1;
  DIRECTION[1] = 0x10;
  _i = 0;
  dir = 0;
  end = 0;
  do {
    if (3 < end) {
      bVar2 = VerifyMoveMap(from,_i);
      if (bVar2) {
        *(ulong *)(_bishopRook + (long)(from + 8) * 8) = _i;
        return;
      }
      __assert_fail("VerifyMoveMap(from, mvs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x22d,"void clunk::InitRookMoves(const int)");
    }
    iVar1 = DIRECTION[(long)end + -2];
    local_40 = from + iVar1;
    if ((local_40 & 0xffffff88) == 0) {
      for (; (local_40 + iVar1 & 0xffffff88) == 0; local_40 = iVar1 + local_40) {
      }
      if ((local_40 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(end)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x226,"void clunk::InitRookMoves(const int)");
      }
      iVar3 = Direction(from,local_40);
      if (iVar3 != iVar1) {
        __assert_fail("Direction(from, end) == dir",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x227,"void clunk::InitRookMoves(const int)");
      }
      if (0x18 < dir) {
        __assert_fail("shift <= 24",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x228,"void clunk::InitRookMoves(const int)");
      }
      _i = (long)(int)(local_40 + 1) << ((byte)dir & 0x3f) | _i;
      dir = dir + 8;
    }
    end = end + 1;
  } while( true );
}

Assistant:

void InitRookMoves(const int from) {
  assert(IS_SQUARE(from));
  const int DIRECTION[4] = {
    South, West, East, North
  };
  uint64_t mvs = 0ULL;
  int shift = 0;
  for (int i = 0; i < 4; ++i) {
    const int dir = DIRECTION[i];
    int end = (from + dir);
    if (IS_SQUARE(end)) {
      while (IS_SQUARE(end + dir)) end += dir;
      assert(IS_SQUARE(end));
      assert(Direction(from, end) == dir);
      assert(shift <= 24);
      mvs |= (uint64_t(end + 1) << shift);
      shift += 8;
    }
  }
  assert(VerifyMoveMap(from, mvs));
  _bishopRook[from + 8] = mvs;
}